

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O2

void QXkbCommon::setXkbContext(QPlatformInputContext *inputContext,xkb_context *context)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  QLoggingCategory *pQVar4;
  QDebug *pQVar5;
  long in_FS_OFFSET;
  QMetaMethod QVar6;
  QLatin1StringView local_68;
  xkb_context *context_local;
  QArrayDataPointer<char16_t> local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  context_local = context;
  if (context != (xkb_context *)0x0 && inputContext != (QPlatformInputContext *)0x0) {
    QObject::objectName();
    local_68.m_size = QtPrivate::lengthHelperPointer<char>("QComposeInputContext");
    local_68.m_data = "QComposeInputContext";
    bVar1 = ::operator!=((QString *)&local_50,&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if (!bVar1) {
      if (setXkbContext(QPlatformInputContext*,xkb_context*)::setXkbContext == '\0') {
        iVar2 = __cxa_guard_acquire(&setXkbContext(QPlatformInputContext*,xkb_context*)::
                                     setXkbContext);
        if (iVar2 != 0) {
          pcVar3 = (char *)(*(code *)**(undefined8 **)inputContext)(inputContext);
          QMetaObject::indexOfMethod(pcVar3);
          iVar2 = (*(code *)**(undefined8 **)inputContext)(inputContext);
          QVar6 = (QMetaMethod)QMetaObject::method(iVar2);
          if (QVar6.mobj == (QMetaObject *)0x0) {
            pQVar4 = QtPrivateLogging::lcQpaKeyMapper();
            if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
              local_38 = pQVar4->name;
              local_50.d._0_4_ = 2;
              local_50.d._4_4_ = 0;
              local_50.ptr._0_4_ = 0;
              local_50.ptr._4_4_ = 0;
              local_50.size._0_4_ = 0;
              local_50.size._4_4_ = 0;
              QMessageLogger::warning();
              pQVar5 = QDebug::operator<<((QDebug *)&local_68,"setXkbContext(xkb_context*)");
              pQVar5 = QDebug::operator<<(pQVar5,"not found on");
              QDebug::operator<<(pQVar5,"QComposeInputContext");
              QDebug::~QDebug((QDebug *)&local_68);
            }
          }
          setXkbContext::setXkbContext = QVar6;
          __cxa_guard_release(&setXkbContext(QPlatformInputContext*,xkb_context*)::setXkbContext);
        }
      }
      if (setXkbContext::setXkbContext.mobj != (QMetaObject *)0x0) {
        local_50.d._0_4_ = 0x7a38d0;
        local_50.d._4_4_ = 0;
        local_50.ptr._0_4_ = 0x61d15e;
        local_50.ptr._4_4_ = 0;
        local_50.size = (qsizetype)&context_local;
        QMetaMethod::invoke<QMetaMethodArgument>
                  (&setXkbContext::setXkbContext,&inputContext->super_QObject,DirectConnection,
                   (QMetaMethodArgument *)&local_50);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXkbCommon::setXkbContext(QPlatformInputContext *inputContext, struct xkb_context *context)
{
    if (!inputContext || !context)
        return;

    const char *const inputContextClassName = "QComposeInputContext";
    const char *const normalizedSignature = "setXkbContext(xkb_context*)";

    if (inputContext->objectName() != QLatin1StringView(inputContextClassName))
        return;

    static const QMetaMethod setXkbContext = [&]() {
        int methodIndex = inputContext->metaObject()->indexOfMethod(normalizedSignature);
        QMetaMethod method = inputContext->metaObject()->method(methodIndex);
        Q_ASSERT(method.isValid());
        if (!method.isValid())
            qCWarning(lcQpaKeyMapper) << normalizedSignature << "not found on" << inputContextClassName;
        return method;
    }();

    if (!setXkbContext.isValid())
        return;

    setXkbContext.invoke(inputContext, Qt::DirectConnection, Q_ARG(struct xkb_context*, context));
}